

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::StreamableToString<char_const*>(string *__return_storage_ptr__,iutest *this,char **value)

{
  iuStreamMessage *this_00;
  iuStreamMessage local_1a0;
  iutest *local_18;
  char **value_local;
  
  local_18 = this;
  value_local = (char **)__return_storage_ptr__;
  detail::iuStreamMessage::iuStreamMessage(&local_1a0);
  this_00 = detail::iuStreamMessage::operator<<(&local_1a0,(char **)local_18);
  detail::iuStreamMessage::GetString_abi_cxx11_(__return_storage_ptr__,this_00);
  detail::iuStreamMessage::~iuStreamMessage(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StreamableToString(const T& value)
{
    return (Message() << value).GetString();
}